

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvector-generator.cpp
# Opt level: O0

ggml_tensor * __thiscall callback_data::filter_nonzero_rows(callback_data *this,ggml_tensor *a)

{
  value_type vVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  size_type sVar5;
  ggml_tensor *pgVar6;
  size_t __size;
  void *pvVar7;
  reference pvVar8;
  long in_RSI;
  undefined8 *in_RDI;
  undefined4 uVar9;
  float src_elem;
  int i;
  int src_row;
  int dest_row;
  ggml_tensor *diff_filtered;
  int n_embd;
  int n_nonzero_rows;
  int i_row;
  vector<int,_std::allocator<int>_> rows_to_copy;
  anon_class_1_0_00000001 is_row_all_zeros;
  undefined8 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  anon_class_1_0_00000001 *in_stack_ffffffffffffff78;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff80;
  ggml_tensor *this_00;
  int local_64;
  int local_5c;
  int local_34;
  vector<int,_std::allocator<int>_> local_30;
  long local_10;
  
  local_10 = in_RSI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1874de);
  for (local_34 = 0; (long)local_34 < *(long *)(local_10 + 0x18); local_34 = local_34 + 1) {
    bVar2 = filter_nonzero_rows::anon_class_1_0_00000001::operator()
                      (in_stack_ffffffffffffff78,
                       (ggml_tensor *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                       (float)in_stack_ffffffffffffff68);
    if (!bVar2) {
      std::vector<int,_std::allocator<int>_>::push_back
                (in_stack_ffffffffffffff80,(value_type_conflict2 *)in_stack_ffffffffffffff78);
    }
  }
  sVar5 = std::vector<int,_std::allocator<int>_>::size(&local_30);
  iVar3 = (int)sVar5;
  iVar4 = (int)*(undefined8 *)(local_10 + 0x10);
  if (iVar3 < 1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/cvector-generator/cvector-generator.cpp"
               ,0x8a,"GGML_ASSERT(%s) failed","n_nonzero_rows > 0");
  }
  pgVar6 = (ggml_tensor *)ggml_new_tensor_2d(*in_RDI,0,(long)iVar4,(long)iVar3);
  this_00 = pgVar6;
  ggml_format_name(pgVar6,"diff_filtered_%s",local_10 + 0x100);
  __size = ggml_nbytes(pgVar6);
  pvVar7 = malloc(__size);
  pgVar6->data = pvVar7;
  for (local_5c = 0; local_5c < iVar3; local_5c = local_5c + 1) {
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(long)local_5c);
    vVar1 = *pvVar8;
    for (local_64 = 0; local_64 < iVar4; local_64 = local_64 + 1) {
      uVar9 = ggml_get_f32_nd(local_10,local_64,vVar1,0);
      ggml_set_f32_nd(uVar9,pgVar6,local_64,local_5c,0);
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
  return pgVar6;
}

Assistant:

struct ggml_tensor * filter_nonzero_rows(struct ggml_tensor * a) {
        //printf("filter_nonzero_rows\n");
        auto is_row_all_zeros = [](struct ggml_tensor * t, int row, float eps) -> bool {
            // check if given row containing all zero elements
            int n_cols = t->ne[0]; // hint: should be equal to n_embd
            for (int col = 0; col < n_cols; ++col) {
                if (ggml_get_f32_nd(t, col, row, 0, 0) > eps) {
                    return false;
                }
            }
            return true;
        };
        std::vector<int> rows_to_copy; // the idx of non-zero cols (to be copied to row of diff_filtered)
        for (int i_row = 0; i_row < a->ne[1]; i_row++) {
            if (!is_row_all_zeros(a, i_row, 1e-6)) {
                rows_to_copy.push_back(i_row);
            }
        }

        // get "n_nonzero_rows" for the output "diff_filtered"
        int n_nonzero_rows = rows_to_copy.size();
        //printf("n_nonzero_rows: %d\n", n_nonzero_rows);
        int n_embd = a->ne[0];
        GGML_ASSERT(n_nonzero_rows > 0);

        // diff_filtered: [n_embd, n_nonzero_rows]
        struct ggml_tensor * diff_filtered = ggml_new_tensor_2d(
            ctx_ggml, GGML_TYPE_F32, n_embd, n_nonzero_rows);
        ggml_format_name(diff_filtered, "diff_filtered_%s", a->name);
        diff_filtered->data = malloc(ggml_nbytes(diff_filtered));

        // copy non-zero rows
        for (int dest_row = 0; dest_row < n_nonzero_rows; dest_row++) {
            int src_row = rows_to_copy[dest_row];
            for (int i = 0; i < n_embd; i++) {
                float src_elem = ggml_get_f32_nd(a, i, src_row, 0, 0);
                ggml_set_f32_nd(diff_filtered, i, dest_row, 0, 0, src_elem);
            }
        }

        //print_debug_tensor(diff_filtered);

        return diff_filtered;
    }